

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DeadInsertElimPass::EliminateDeadInsertsOnePass
          (DeadInsertElimPass *this,Function *func)

{
  pointer ppIVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  Op OVar2;
  bool bVar3;
  uint32_t uVar4;
  int32_t iVar5;
  DefUseManager *pDVar6;
  Instruction *pIVar7;
  iterator iVar8;
  BasicBlock *pBVar9;
  Instruction **ppIVar10;
  pointer puVar11;
  pointer puVar12;
  uint32_t id;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  dead_instructions;
  _Any_data local_50;
  pointer local_40;
  code *local_38;
  
  this_00 = &this->liveInserts_;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&this_00->_M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->visitedPhis_)._M_h);
  puVar11 = (func->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar11 ==
        (func->blocks_).
        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      dead_instructions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dead_instructions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dead_instructions.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = false;
      for (puVar12 = (func->blocks_).
                     super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar11;
          puVar12 = puVar12 + 1) {
        pBVar9 = (puVar12->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        ppIVar10 = (Instruction **)
                   ((long)&(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
        while (pIVar7 = *ppIVar10,
              pIVar7 != &(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
        {
          if (pIVar7->opcode_ == OpCompositeInsert) {
            id = Instruction::result_id(pIVar7);
            iVar8 = std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&this_00->_M_h,&id);
            if (iVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
              uVar4 = Instruction::GetSingleWordInOperand(pIVar7,1);
              IRContext::ReplaceAllUsesWith((this->super_MemPass).super_Pass.context_,id,uVar4);
              local_50._M_unused._0_8_ = (undefined8)pIVar7;
              std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
              emplace_back<spvtools::opt::Instruction*>
                        ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                          *)&dead_instructions,(Instruction **)&local_50);
              bVar3 = true;
            }
            pBVar9 = (puVar12->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          }
          ppIVar10 = &(pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        }
        puVar11 = (func->blocks_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      while (dead_instructions.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             dead_instructions.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        ppIVar1 = dead_instructions.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        dead_instructions.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             dead_instructions.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_50._8_8_ = (DeadInsertElimPass *)0x0;
        local_38 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:241:19)>
                   ::_M_invoke;
        local_40 = (pointer)std::
                            _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:241:19)>
                            ::_M_manager;
        local_50._M_unused._M_object = (Instruction *)&dead_instructions;
        MemPass::DCEInst(&this->super_MemPass,*ppIVar1,
                         (function<void_(spvtools::opt::Instruction_*)> *)&local_50);
        if (local_40 != (pointer)0x0) {
          (*(code *)local_40)(&local_50,&local_50,3);
        }
      }
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&dead_instructions.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      return bVar3;
    }
    pBVar9 = (puVar11->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    ppIVar10 = (Instruction **)
               ((long)&(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    while (dead_instructions.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppIVar10,
          (Instruction *)
          dead_instructions.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          &(pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      OVar2 = ((Instruction *)
              dead_instructions.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->opcode_;
      pDVar6 = Pass::get_def_use_mgr((Pass *)this);
      uVar4 = Instruction::type_id
                        ((Instruction *)
                         dead_instructions.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      pIVar7 = analysis::DefUseManager::GetDef(pDVar6,uVar4);
      if (OVar2 == OpCompositeInsert) {
        if (pIVar7->opcode_ != OpTypeArray) goto LAB_001cf561;
        uVar4 = Instruction::result_id
                          ((Instruction *)
                           dead_instructions.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        local_50._0_4_ = uVar4;
        std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)this_00,(value_type *)local_50._M_pod_data);
      }
      else if ((OVar2 == OpPhi) && (iVar5 = spvOpcodeIsComposite(pIVar7->opcode_), iVar5 != 0)) {
LAB_001cf561:
        uVar4 = Instruction::result_id
                          ((Instruction *)
                           dead_instructions.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        pDVar6 = Pass::get_def_use_mgr((Pass *)this);
        local_50._M_unused._M_object = &dead_instructions;
        local_38 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:195:42)>
                   ::_M_invoke;
        local_40 = (pointer)std::
                            _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_insert_elim_pass.cpp:195:42)>
                            ::_M_manager;
        local_50._8_8_ = this;
        analysis::DefUseManager::ForEachUser
                  (pDVar6,uVar4,(function<void_(spvtools::opt::Instruction_*)> *)&local_50);
        if (local_40 != (pointer)0x0) {
          (*(code *)local_40)(&local_50,&local_50,3);
        }
      }
      pBVar9 = (puVar11->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      ppIVar10 = dead_instructions.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    puVar11 = puVar11 + 1;
  } while( true );
}

Assistant:

bool DeadInsertElimPass::EliminateDeadInsertsOnePass(Function* func) {
  bool modified = false;
  liveInserts_.clear();
  visitedPhis_.clear();
  // Mark all live inserts
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      // Only process Inserts and composite Phis
      spv::Op op = ii->opcode();
      Instruction* typeInst = get_def_use_mgr()->GetDef(ii->type_id());
      if (op != spv::Op::OpCompositeInsert &&
          (op != spv::Op::OpPhi || !spvOpcodeIsComposite(typeInst->opcode())))
        continue;
      // The marking algorithm can be expensive for large arrays and the
      // efficacy of eliminating dead inserts into arrays is questionable.
      // Skip optimizing array inserts for now. Just mark them live.
      // TODO(greg-lunarg): Eliminate dead array inserts
      if (op == spv::Op::OpCompositeInsert) {
        if (typeInst->opcode() == spv::Op::OpTypeArray) {
          liveInserts_.insert(ii->result_id());
          continue;
        }
      }
      const uint32_t id = ii->result_id();
      get_def_use_mgr()->ForEachUser(id, [&ii, this](Instruction* user) {
        if (user->IsCommonDebugInstr()) return;
        switch (user->opcode()) {
          case spv::Op::OpCompositeInsert:
          case spv::Op::OpPhi:
            // Use by insert or phi does not initiate marking
            break;
          case spv::Op::OpCompositeExtract: {
            // Capture extract indices
            std::vector<uint32_t> extIndices;
            uint32_t icnt = 0;
            user->ForEachInOperand([&icnt, &extIndices](const uint32_t* idp) {
              if (icnt > 0) extIndices.push_back(*idp);
              ++icnt;
            });
            // Mark all inserts in chain that intersect with extract
            std::unordered_set<uint32_t> visited_phis;
            MarkInsertChain(&*ii, &extIndices, 0, &visited_phis);
          } break;
          default: {
            // Mark inserts in chain for all components
            std::unordered_set<uint32_t> visited_phis;
            MarkInsertChain(&*ii, nullptr, 0, &visited_phis);
          } break;
        }
      });
    }
  }
  // Find and disconnect dead inserts
  std::vector<Instruction*> dead_instructions;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      if (ii->opcode() != spv::Op::OpCompositeInsert) continue;
      const uint32_t id = ii->result_id();
      if (liveInserts_.find(id) != liveInserts_.end()) continue;
      const uint32_t replId =
          ii->GetSingleWordInOperand(kInsertCompositeIdInIdx);
      (void)context()->ReplaceAllUsesWith(id, replId);
      dead_instructions.push_back(&*ii);
      modified = true;
    }
  }
  // DCE dead inserts
  while (!dead_instructions.empty()) {
    Instruction* inst = dead_instructions.back();
    dead_instructions.pop_back();
    DCEInst(inst, [&dead_instructions](Instruction* other_inst) {
      auto i = std::find(dead_instructions.begin(), dead_instructions.end(),
                         other_inst);
      if (i != dead_instructions.end()) {
        dead_instructions.erase(i);
      }
    });
  }
  return modified;
}